

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

CharCount UnifiedRegex::MatchCharNode::FindUniqueEquivs(Char *equivs,Char *uniqueEquivs)

{
  uint uVar1;
  CharCount equivIndex;
  long lVar2;
  long lVar3;
  
  *uniqueEquivs = *equivs;
  uVar1 = 1;
  lVar2 = 1;
  do {
    if (uVar1 != 0) {
      lVar3 = 0;
      do {
        if (uniqueEquivs[lVar3] == equivs[lVar2]) goto LAB_00eaca95;
        lVar3 = lVar3 + 1;
      } while (uVar1 != (uint)lVar3);
    }
    uniqueEquivs[uVar1] = equivs[lVar2];
    uVar1 = uVar1 + 1;
LAB_00eaca95:
    lVar2 = lVar2 + 1;
    if (lVar2 == 4) {
      return uVar1;
    }
  } while( true );
}

Assistant:

CharCount MatchCharNode::FindUniqueEquivs(const Char equivs[CaseInsensitive::EquivClassSize], __out_ecount(4) Char uniqueEquivs[CaseInsensitive::EquivClassSize])
    {
        uniqueEquivs[0] = equivs[0];
        CharCount uniqueCount = 1;
        for (CharCount equivIndex = 1; equivIndex < CaseInsensitive::EquivClassSize; ++equivIndex)
        {
            bool alreadyHave = false;
            for (CharCount uniqueIndex = 0; uniqueIndex < uniqueCount; ++uniqueIndex)
            {
                if (uniqueEquivs[uniqueIndex] == equivs[equivIndex])
                {
                    alreadyHave = true;
                    break;
                }
            }

            if (!alreadyHave)
            {
                uniqueEquivs[uniqueCount] = equivs[equivIndex];
                uniqueCount += 1;
            }
        }

        return uniqueCount;
    }